

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O0

stringpiece_ssize_type __thiscall
google::protobuf::StringPiece::find_first_not_of(StringPiece *this,char c,size_type pos)

{
  ulong local_28;
  size_type pos_local;
  char c_local;
  StringPiece *this_local;
  
  local_28 = pos;
  if (0 < this->length_) {
    for (; local_28 < (ulong)this->length_; local_28 = local_28 + 1) {
      if (this->ptr_[local_28] != c) {
        return local_28;
      }
    }
  }
  return -1;
}

Assistant:

stringpiece_ssize_type StringPiece::find_first_not_of(char c,
                                                      size_type pos) const {
  if (length_ <= 0) return npos;

  for (; pos < static_cast<size_type>(length_); ++pos) {
    if (ptr_[pos] != c) {
      return pos;
    }
  }
  return npos;
}